

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::Instance::Instance(Instance *this)

{
  affine3f *in_RDI;
  
  Entity::Entity((Entity *)in_RDI);
  *(undefined ***)&(in_RDI->l).vx = &PTR_toString_abi_cxx11__002199c0;
  std::shared_ptr<pbrt::Object>::shared_ptr((shared_ptr<pbrt::Object> *)0x148f14);
  math::affine3f::affine3f(in_RDI);
  std::mutex::mutex((mutex *)0x148f32);
  *(undefined1 *)&in_RDI[2].l.vz.z = 0;
  math::box3f::box3f((box3f *)in_RDI);
  return;
}

Assistant:

Instance() {}